

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

bool cvui::internal::button
               (cvui_block_t *theBlock,int theX,int theY,Mat *theIdle,Mat *theOver,Mat *theDown,
               bool theUpdateLayout)

{
  Size_<int> local_58;
  Size_<int> local_50;
  Size aSize;
  int aStatus;
  Rect aRect;
  bool theUpdateLayout_local;
  Mat *theDown_local;
  Mat *theOver_local;
  Mat *theIdle_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  cv::Rect_<int>::Rect_
            ((Rect_<int> *)&aSize.height,theX,theY,*(int *)(theIdle + 0xc),*(int *)(theIdle + 8));
  aSize.width = cvui::iarea(theX,theY,aRect.x,aRect.y);
  if (aSize.width == 2) {
    render::image(theBlock,(Rect *)&aSize.height,theDown);
  }
  else if (aSize.width == 4) {
    render::image(theBlock,(Rect *)&aSize.height,theOver);
  }
  else if (aSize.width == 5) {
    render::image(theBlock,(Rect *)&aSize.height,theIdle);
  }
  if (theUpdateLayout) {
    cv::Size_<int>::Size_(&local_50,aRect.x,aRect.y);
    cv::Size_<int>::Size_(&local_58,&local_50);
    updateLayoutFlow(theBlock,&local_58);
  }
  return aSize.width == 3;
}

Assistant:

bool button(cvui_block_t& theBlock, int theX, int theY, cv::Mat& theIdle, cv::Mat& theOver, cv::Mat& theDown, bool theUpdateLayout) {
		cv::Rect aRect(theX, theY, theIdle.cols, theIdle.rows);
		int aStatus = cvui::iarea(theX, theY, aRect.width, aRect.height);

		switch (aStatus) {
			case cvui::OUT: render::image(theBlock, aRect, theIdle); break;
			case cvui::OVER: render::image(theBlock, aRect, theOver); break;
			case cvui::DOWN: render::image(theBlock, aRect, theDown); break;
		}

		// Update the layout flow according to button size
		// if we were told to update.
		if (theUpdateLayout) {
			cv::Size aSize(aRect.width, aRect.height);
			updateLayoutFlow(theBlock, aSize);
		}

		// Return true if the button was clicked
		return aStatus == cvui::CLICK;
	}